

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BronKerbosch.cpp
# Opt level: O2

void __thiscall BronKerbosch::~BronKerbosch(BronKerbosch *this)

{
  pointer ppAVar1;
  AlignmentRecord *this_00;
  _List_base<unsigned_long,_std::allocator<unsigned_long>_> *this_01;
  vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  *this_02;
  AlignmentRecord **alignment;
  pointer ppAVar2;
  
  (this->super_CliqueFinder)._vptr_CliqueFinder = (_func_int **)&PTR__BronKerbosch_001d6d88;
  if ((this->super_CliqueFinder).cliques != (clique_list_t *)0x0) {
    finish(this);
  }
  ppAVar1 = (this->alignments_).
            super__Vector_base<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppAVar2 = (this->alignments_).
                 super__Vector_base<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppAVar2 != ppAVar1; ppAVar2 = ppAVar2 + 1) {
    this_00 = *ppAVar2;
    if (this_00 != (AlignmentRecord *)0x0) {
      AlignmentRecord::~AlignmentRecord(this_00);
    }
    operator_delete(this_00);
  }
  this_01 = &this->order_->super__List_base<unsigned_long,_std::allocator<unsigned_long>_>;
  if (this_01 != (_List_base<unsigned_long,_std::allocator<unsigned_long>_> *)0x0) {
    std::__cxx11::_List_base<unsigned_long,_std::allocator<unsigned_long>_>::_M_clear(this_01);
  }
  operator_delete(this_01);
  this_02 = this->vertices_;
  if (this_02 !=
      (vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
       *)0x0) {
    std::
    vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ::~vector(this_02);
  }
  operator_delete(this_02);
  std::_Vector_base<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>::~_Vector_base
            (&(this->alignments_).
              super__Vector_base<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>);
  return;
}

Assistant:

BronKerbosch::~BronKerbosch() {
    if (cliques != nullptr) {
        finish();
    }
    for (auto&& alignment : alignments_) {
        delete alignment;
    }
    delete order_;
    delete vertices_;
}